

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::ClearEntityAppearanceList(SilentEntitySystem *this)

{
  SilentEntitySystem *this_local;
  
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::clear(&this->m_vEA);
  this->m_ui16NumOfAppearanceRecords = 0;
  return;
}

Assistant:

void SilentEntitySystem::ClearEntityAppearanceList()
{
    m_vEA.clear();
    m_ui16NumOfAppearanceRecords = 0;
}